

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

void __thiscall helics::Federate::setProperty(Federate *this,int32_t option,double timeValue)

{
  uint uVar1;
  element_type *this_00;
  uint in_ESI;
  long in_RDI;
  double in_stack_ffffffffffffffb8;
  TimeRepresentation<count_time<9,_long>_> *in_stack_ffffffffffffffc0;
  undefined8 local_28;
  
  if (in_ESI == 0x98) {
    TimeRepresentation<count_time<9,_long>_>::operator=
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  else {
    this_00 = std::__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x343cab);
    uVar1 = *(uint *)(in_RDI + 0x10);
    TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
              ((TimeRepresentation<count_time<9,_long>_> *)this_00,in_stack_ffffffffffffffb8);
    (*this_00->_vptr_Core[0x1d])(this_00,(ulong)uVar1,(ulong)in_ESI,local_28);
  }
  return;
}

Assistant:

void Federate::setProperty(int32_t option, double timeValue)
{
    if (option == defs::Properties::STOPTIME) {
        mStopTime = timeValue;
        return;
    }
    coreObject->setTimeProperty(fedID, option, timeValue);
}